

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O1

void AssemblyCode::colorToRegisterChange
               (CTemp *temp,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *tempToColorMap,RegisterInfo *registerInfo)

{
  iterator iVar1;
  string local_40;
  
  totalAllocated = 0;
  IRT::CTemp::ToString_abi_cxx11_(&local_40,temp);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&tempToColorMap->_M_t,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar1._M_node != &(tempToColorMap->_M_t)._M_impl.super__Rb_tree_header) {
    IRT::CTemp::setName(temp,(registerInfo->registers).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                             (int)iVar1._M_node[2]._M_color);
  }
  return;
}

Assistant:

void AssemblyCode::colorToRegisterChange( IRT::CTemp& temp,
                            std::map<std::string, int> &tempToColorMap, AssemblyCode::RegisterInfo &registerInfo ) {
    totalAllocated = 0;
    auto mapEntry = tempToColorMap.find(temp.ToString());
    if (mapEntry != tempToColorMap.end()) {
        temp.setName(registerInfo.registers[mapEntry->second]);
    }
}